

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_of_detail.c
# Opt level: O0

bool_t prf_level_of_detail_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  int16_t iVar2;
  int32_t iVar3;
  void *pvVar4;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  float64_t fVar5;
  char *pcVar6;
  uint8_t *puVar7;
  _func_int_float_void_ptr *p_Var8;
  bfile_t *unaff_retaddr;
  node_data_conflict5 *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar9;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar10;
  
  uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar1;
  if (*in_RDI == prf_level_of_detail_info.opcode) {
    uVar1 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar1;
    if (in_RDI[1] < 0x48) {
      prf_error(9,"level of detail node too short (%d bytes)",(ulong)in_RDI[1]);
      bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
      bVar10 = 0;
    }
    else {
      if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
        if (*(short *)(*in_RSI + 8) == 0) {
          pvVar4 = malloc((long)(int)(in_RDI[1] - 4) + 4);
          *(void **)(in_RDI + 4) = pvVar4;
        }
        else {
          pvVar4 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
          *(void **)(in_RDI + 4) = pvVar4;
        }
        if (*(long *)(in_RDI + 4) == 0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
          return 0;
        }
      }
      iVar9 = 4;
      bfile_00 = *(bfile_t **)(in_RDI + 4);
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
      iVar9 = iVar9 + 8;
      iVar3 = bf_get_int32_be(bfile_00);
      *(int32_t *)&bfile_00->file = iVar3;
      iVar9 = iVar9 + 4;
      fVar5 = bf_get_float64_be(bfile_00);
      bfile_00->size = (size_t)fVar5;
      iVar9 = iVar9 + 8;
      fVar5 = bf_get_float64_be(bfile_00);
      bfile_00->pos = (size_t)fVar5;
      iVar9 = iVar9 + 8;
      iVar2 = bf_get_int16_be(bfile_00);
      *(int16_t *)&bfile_00->ipos = iVar2;
      iVar9 = iVar9 + 2;
      iVar2 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00->ipos + 2) = iVar2;
      iVar9 = iVar9 + 2;
      iVar3 = bf_get_int32_be(bfile_00);
      *(int32_t *)((long)&bfile_00->ipos + 4) = iVar3;
      iVar9 = iVar9 + 4;
      pcVar6 = (char *)bf_get_float64_be(bfile_00);
      bfile_00->filename = pcVar6;
      iVar9 = iVar9 + 8;
      puVar7 = (uint8_t *)bf_get_float64_be(bfile_00);
      bfile_00->buffer = puVar7;
      iVar9 = iVar9 + 8;
      fVar5 = bf_get_float64_be(bfile_00);
      *(float64_t *)&bfile_00->buffer_size = fVar5;
      iVar9 = iVar9 + 8;
      p_Var8 = (_func_int_float_void_ptr *)bf_get_float64_be(bfile_00);
      bfile_00->progress_cb = p_Var8;
      if (iVar9 + 8 < (int)(uint)in_RDI[1]) {
        bf_read(unaff_retaddr,
                (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (uint)((ulong)in_RDI >> 0x20));
      }
      bVar10 = 1;
    }
  }
  else {
    prf_error(9,"tried level of detail node load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar10 = 0;
  }
  return bVar10;
}

Assistant:

static bool_t
prf_level_of_detail_load_f(prf_node_t * node,
                           prf_state_t * state,
                           bfile_t * bfile)
{
  int pos;

  assert(node != NULL && state != NULL && bfile != NULL);
  
  node->opcode = bf_get_uint16_be(bfile);
  if (node->opcode != prf_level_of_detail_info.opcode) {
    prf_error(9,
              "tried level of detail node load method on node of type %d.",
              node->opcode);
    bf_rewind(bfile, 2);
    return FALSE;
  }

  node->length = bf_get_uint16_be(bfile);
  if (node->length < NODE_DATA_SIZE + 4) {
    prf_error(9, "level of detail node too short (%d bytes)", node->length);
    bf_rewind(bfile, 4);
    return FALSE;
  }

  if (node->length > 4 && node->data == NULL) {
    assert(state->model != NULL);
    if (state->model->mempool_id == 0) {
      node->data = (uint8_t *)malloc(node->length - 4 + NODE_DATA_PAD);
    }
    else {
      node->data = (uint8_t *)pool_malloc(state->model->mempool_id,
                                          node->length - 4 + NODE_DATA_PAD);
    }
    if (node->data == NULL) {
      prf_error(9, "memory allocation problem (returned NULL)");
      bf_rewind(bfile, 4);
      return FALSE;
    }
  }

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;
    bf_read(bfile, data->id, 8); pos += 8;
    data->reserved = bf_get_int32_be(bfile); pos += 4;
    data->switch_in_distance = bf_get_float64_be(bfile); pos += 8;
    data->switch_out_distance = bf_get_float64_be(bfile); pos += 8;
    data->special_effect_id1 = bf_get_int16_be(bfile); pos += 2;
    data->special_effect_id2 = bf_get_int16_be(bfile); pos += 2;
    data->flags = bf_get_int32_be(bfile); pos += 4;
    data->center_x = bf_get_float64_be(bfile); pos += 8;
    data->center_y = bf_get_float64_be(bfile); pos += 8;
    data->center_z = bf_get_float64_be(bfile); pos += 8;
    data->transition_range = bf_get_float64_be(bfile); pos += 8;
  } while (FALSE);

  if (node->length > pos) {
    pos += bf_read(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                   node->length - pos);
  }
  return TRUE;
}